

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TIntermediate::promoteConstantUnion
          (TIntermediate *this,TBasicType promoteTo,TIntermConstantUnion *node)

{
  TConstUnionVector **ppTVar1;
  double dVar2;
  TStorageQualifier TVar3;
  int iVar4;
  uint size;
  int iVar5;
  undefined4 uVar6;
  int mr;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pTVar7;
  long *plVar8;
  long lVar9;
  undefined4 extraout_var_02;
  TBasicType TVar10;
  pointer pTVar11;
  ushort uVar12;
  uint uVar13;
  undefined4 in_register_00000034;
  ulong uVar14;
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar15;
  ulong uVar16;
  bool bVar17;
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar18;
  TConstUnionArray leftUnionArray;
  TConstUnionArray local_e0;
  undefined8 local_d0;
  TType local_c8;
  undefined4 extraout_var_01;
  
  local_d0 = CONCAT44(in_register_00000034,promoteTo);
  iVar4 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
  size = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar4));
  TConstUnionArray::TConstUnionArray(&local_e0,size);
  if ((int)size < 1) {
LAB_00496e38:
    iVar4 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    plVar8 = (long *)CONCAT44(extraout_var_01,iVar4);
    lVar9 = (**(code **)(*plVar8 + 0x58))(plVar8);
    TVar3 = *(TStorageQualifier *)(lVar9 + 8);
    iVar4 = (**(code **)(*plVar8 + 0x60))(plVar8);
    iVar5 = (**(code **)(*plVar8 + 0x68))(plVar8);
    mr = (**(code **)(*plVar8 + 0x70))(plVar8);
    TType::TType(&local_c8,(TBasicType)local_d0,TVar3 & 0x7f,iVar4,iVar5,mr,false);
    iVar4 = (**(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)();
    node = addConstantUnion((TIntermediate *)node,&local_e0,&local_c8,
                            (TSourceLoc *)CONCAT44(extraout_var_02,iVar4),false);
switchD_00496460_default:
    return &node->super_TIntermTyped;
  }
  ppTVar1 = &(node->constArray).unionArray;
  uVar16 = 0;
  iVar4 = (int)local_d0 + -1;
LAB_00496438:
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
  uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x38))
                    ((long *)CONCAT44(extraout_var_00,iVar5));
  switch(uVar6) {
  case 1:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      goto switchD_00496557_caseD_0;
    case 3:
switchD_00496557_caseD_3:
      pTVar7 = ((local_e0.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar7[uVar16].field_0.i8Const =
           (char)(int)((*ppTVar1)->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.dConst;
LAB_004968d8:
      pTVar7 = pTVar7 + uVar16;
      TVar10 = EbtInt8;
      break;
    case 4:
switchD_00496557_caseD_4:
      pTVar7 = ((local_e0.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar7[uVar16].field_0.i8Const =
           (char)(int)((*ppTVar1)->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.dConst;
LAB_00496881:
      pTVar7 = pTVar7 + uVar16;
      TVar10 = EbtUint8;
      break;
    case 5:
switchD_00496557_caseD_5:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      pTVar11[uVar16].field_0.i16Const =
           (short)(int)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.dConst;
LAB_00496ca2:
      TVar10 = EbtInt16;
      break;
    case 6:
switchD_00496557_caseD_6:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      pTVar11[uVar16].field_0.i16Const =
           (short)(int)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.dConst;
LAB_00496cf3:
      TVar10 = EbtUint16;
      break;
    case 7:
switchD_00496557_caseD_7:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      pTVar11[uVar16].field_0.iConst =
           (int)((*ppTVar1)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.dConst;
LAB_00496dfb:
      TVar10 = EbtInt;
      break;
    case 8:
switchD_00496557_caseD_8:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      pTVar11[uVar16].field_0.iConst =
           (int)(long)((*ppTVar1)->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.dConst;
LAB_00496db1:
      TVar10 = EbtUint;
      break;
    case 9:
switchD_00496557_caseD_9:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      pTVar11[uVar16].field_0.i64Const =
           (long)((*ppTVar1)->
                 super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
                 .
                 super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.dConst;
LAB_00496e24:
      TVar10 = EbtInt64;
      break;
    case 10:
switchD_00496557_caseD_a:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      dVar2 = ((*ppTVar1)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.dConst;
      uVar14 = (ulong)dVar2;
      pTVar11[uVar16].field_0.u64Const =
           (long)(dVar2 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
LAB_00496d85:
      TVar10 = EbtUint64;
      break;
    case 0xb:
switchD_00496557_caseD_b:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      pTVar11[uVar16].field_0.bConst =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.dConst != 0.0;
      goto LAB_00496b30;
    default:
      goto switchD_00496460_default;
    }
    goto LAB_00496e29;
  case 2:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      goto switchD_00496557_caseD_0;
    case 3:
      goto switchD_00496557_caseD_3;
    case 4:
      goto switchD_00496557_caseD_4;
    case 5:
      goto switchD_00496557_caseD_5;
    case 6:
      goto switchD_00496557_caseD_6;
    case 7:
      goto switchD_00496557_caseD_7;
    case 8:
      goto switchD_00496557_caseD_8;
    case 9:
      goto switchD_00496557_caseD_9;
    case 10:
      goto switchD_00496557_caseD_a;
    case 0xb:
      goto switchD_00496557_caseD_b;
    default:
      return &node->super_TIntermTyped;
    }
  case 3:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
switchD_00496557_caseD_0:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = uVar16 * 0x10;
      pTVar7 = pTVar11 + uVar16;
      aVar18 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0;
      break;
    case 3:
      goto switchD_00496557_caseD_3;
    case 4:
      goto switchD_00496557_caseD_4;
    case 5:
      goto switchD_00496557_caseD_5;
    case 6:
      goto switchD_00496557_caseD_6;
    case 7:
      goto switchD_00496557_caseD_7;
    case 8:
      goto switchD_00496557_caseD_8;
    case 9:
      goto switchD_00496557_caseD_9;
    case 10:
      goto switchD_00496557_caseD_a;
    case 0xb:
      goto switchD_00496557_caseD_b;
    default:
      goto switchD_00496460_default;
    }
    break;
  case 4:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
switchD_00496494_caseD_0:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
      goto LAB_00496689;
    case 3:
switchD_00496494_caseD_3:
      pTVar7 = ((local_e0.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar7[uVar16].field_0.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
      goto LAB_004968d8;
    case 4:
switchD_00496494_caseD_4:
      pTVar7 = ((local_e0.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar7[uVar16].field_0.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
      goto LAB_00496881;
    case 5:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ushort)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
LAB_00496c9e:
      pTVar7 = pTVar11 + uVar16;
      *(ushort *)&pTVar11[uVar16].field_0 = uVar12;
      goto LAB_00496ca2;
    case 6:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ushort)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
LAB_00496cef:
      pTVar7 = pTVar11 + uVar16;
      *(ushort *)&pTVar11[uVar16].field_0 = uVar12;
      goto LAB_00496cf3;
    case 7:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
LAB_00496df8:
      *(uint *)&pTVar11[uVar16].field_0 = uVar13;
      goto LAB_00496dfb;
    case 8:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
LAB_00496dae:
      *(uint *)&pTVar11[uVar16].field_0 = uVar13;
      goto LAB_00496db1;
    case 9:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar15 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
LAB_00496e20:
      pTVar11[uVar16].field_0 = aVar15;
      goto LAB_00496e24;
    case 10:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar18 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
LAB_00496d81:
      pTVar11[uVar16].field_0 = aVar18;
      goto LAB_00496d85;
    case 0xb:
switchD_004964d6_caseD_b:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      bVar17 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const == '\0';
LAB_00496b2c:
      pTVar11[uVar16].field_0.bConst = !bVar17;
      break;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_00496b30;
  case 5:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u8Const;
      break;
    case 3:
      goto switchD_00496494_caseD_3;
    case 4:
      goto switchD_00496494_caseD_4;
    case 5:
switchD_00496494_caseD_5:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ushort)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u8Const;
      goto LAB_00496c9e;
    case 6:
switchD_00496494_caseD_6:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ushort)((*ppTVar1)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u8Const;
      goto LAB_00496cef;
    case 7:
switchD_00496494_caseD_7:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u8Const;
      goto LAB_00496df8;
    case 8:
switchD_00496494_caseD_8:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u8Const;
      goto LAB_00496dae;
    case 9:
switchD_00496494_caseD_9:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar15.i64Const._1_7_ = 0;
      aVar15.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u8Const;
      goto LAB_00496e20;
    case 10:
switchD_00496494_caseD_a:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar18.i64Const._1_7_ = 0;
      aVar18.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u8Const;
      goto LAB_00496d81;
    case 0xb:
      goto switchD_004964d6_caseD_b;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_00496689;
  case 6:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i16Const;
      break;
    case 3:
      goto switchD_00496494_caseD_3;
    case 4:
      goto switchD_00496494_caseD_4;
    case 5:
switchD_004966b7_caseD_5:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      pTVar11[uVar16].field_0.i16Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i16Const;
      goto LAB_00496ca2;
    case 6:
switchD_004966b7_caseD_6:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      pTVar11[uVar16].field_0.i16Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i16Const;
      goto LAB_00496cf3;
    case 7:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i16Const;
      goto LAB_00496df8;
    case 8:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i16Const;
      goto LAB_00496dae;
    case 9:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar15 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i16Const;
      goto LAB_00496e20;
    case 10:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar18 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i16Const;
      goto LAB_00496d81;
    case 0xb:
switchD_00496668_caseD_b:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      bVar17 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i16Const == 0;
      goto LAB_00496b2c;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_00496689;
  case 7:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u16Const;
LAB_00496689:
      lVar9 = uVar16 << 4;
      aVar18 = (uint)(double)uVar13;
      break;
    case 3:
      goto switchD_00496494_caseD_3;
    case 4:
      goto switchD_00496494_caseD_4;
    case 5:
      goto switchD_004966b7_caseD_5;
    case 6:
      goto switchD_004966b7_caseD_6;
    case 7:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u16Const;
      goto LAB_00496df8;
    case 8:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = (uint)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u16Const;
      goto LAB_00496dae;
    case 9:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar15.i64Const._2_6_ = 0;
      aVar15.i16Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u16Const;
      goto LAB_00496e20;
    case 10:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar18.i64Const._2_6_ = 0;
      aVar18.i16Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.u16Const;
      goto LAB_00496d81;
    case 0xb:
      goto switchD_00496668_caseD_b;
    default:
      goto switchD_00496460_default;
    }
    break;
  case 8:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = uVar16 * 0x10;
      pTVar7 = pTVar11 + uVar16;
      aVar18.dConst =
           (double)((*ppTVar1)->
                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ).
                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.iConst;
      break;
    case 3:
      goto switchD_00496494_caseD_3;
    case 4:
      goto switchD_00496494_caseD_4;
    case 5:
      goto switchD_004966b7_caseD_5;
    case 6:
      goto switchD_004966b7_caseD_6;
    case 7:
switchD_004966b7_caseD_7:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.iConst;
      goto LAB_00496df8;
    case 8:
switchD_004966b7_caseD_8:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      uVar13 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.iConst;
      goto LAB_00496dae;
    case 9:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar15 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.iConst;
      goto LAB_00496e20;
    case 10:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar18 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)((*ppTVar1)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.iConst;
      goto LAB_00496d81;
    case 0xb:
switchD_00496713_caseD_b:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      bVar17 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.iConst == 0;
      goto LAB_00496b2c;
    default:
      goto switchD_00496460_default;
    }
    break;
  case 9:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = uVar16 * 0x10;
      pTVar7 = pTVar11 + uVar16;
      aVar18.dConst =
           (double)((*ppTVar1)->
                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ).
                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.uConst;
      break;
    case 3:
      goto switchD_00496494_caseD_3;
    case 4:
      goto switchD_00496494_caseD_4;
    case 5:
      goto switchD_004966b7_caseD_5;
    case 6:
      goto switchD_004966b7_caseD_6;
    case 7:
      goto switchD_004966b7_caseD_7;
    case 8:
      goto switchD_004966b7_caseD_8;
    case 9:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar15.i64Const._4_4_ = 0;
      aVar15.iConst =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.uConst;
      goto LAB_00496e20;
    case 10:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar18.i64Const._4_4_ = 0;
      aVar18.iConst =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.uConst;
      goto LAB_00496d81;
    case 0xb:
      goto switchD_00496713_caseD_b;
    default:
      goto switchD_00496460_default;
    }
    break;
  case 10:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = uVar16 * 0x10;
      pTVar7 = pTVar11 + uVar16;
      aVar18.dConst =
           (double)((*ppTVar1)->
                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ).
                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i64Const;
      break;
    case 3:
      goto switchD_00496494_caseD_3;
    case 4:
      goto switchD_00496494_caseD_4;
    case 5:
      goto switchD_004966b7_caseD_5;
    case 6:
      goto switchD_004966b7_caseD_6;
    case 7:
      goto switchD_004966b7_caseD_7;
    case 8:
      goto switchD_004966b7_caseD_8;
    case 9:
switchD_004966b7_caseD_9:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar15 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0;
      goto LAB_00496e20;
    case 10:
switchD_004966b7_caseD_a:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar18 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0;
      goto LAB_00496d81;
    case 0xb:
switchD_004966b7_caseD_b:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      bVar17 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i64Const == 0;
      goto LAB_00496b2c;
    default:
      goto switchD_00496460_default;
    }
    break;
  case 0xb:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      aVar18 = ((*ppTVar1)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].field_0;
      pTVar11[uVar16].field_0.dConst =
           ((double)CONCAT44(0x45300000,(int)((ulong)aVar18 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,aVar18.iConst) - 4503599627370496.0);
      break;
    case 3:
      goto switchD_00496494_caseD_3;
    case 4:
      goto switchD_00496494_caseD_4;
    case 5:
      goto switchD_004966b7_caseD_5;
    case 6:
      goto switchD_004966b7_caseD_6;
    case 7:
      goto switchD_004966b7_caseD_7;
    case 8:
      goto switchD_004966b7_caseD_8;
    case 9:
      goto switchD_004966b7_caseD_9;
    case 10:
      goto switchD_004966b7_caseD_a;
    case 0xb:
      goto switchD_004966b7_caseD_b;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_00496695;
  case 0xc:
    switch(iVar4) {
    case 0:
    case 1:
    case 2:
      goto switchD_00496494_caseD_0;
    case 3:
      goto switchD_00496494_caseD_3;
    case 4:
      goto switchD_00496494_caseD_4;
    case 5:
      goto switchD_00496494_caseD_5;
    case 6:
      goto switchD_00496494_caseD_6;
    case 7:
      goto switchD_00496494_caseD_7;
    case 8:
      goto switchD_00496494_caseD_8;
    case 9:
      goto switchD_00496494_caseD_9;
    case 10:
      goto switchD_00496494_caseD_a;
    case 0xb:
      pTVar11 = ((local_e0.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar7 = pTVar11 + uVar16;
      pTVar11[uVar16].field_0.i8Const =
           ((*ppTVar1)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar16].field_0.i8Const;
LAB_00496b30:
      TVar10 = EbtBool;
      goto LAB_00496e29;
    }
  default:
    goto switchD_00496460_default;
  }
  ((anon_union_8_11_a9b10978_for_TConstUnion_0 *)((long)&pTVar11->field_0 + lVar9))->dConst =
       (double)aVar18;
LAB_00496695:
  TVar10 = EbtDouble;
LAB_00496e29:
  pTVar7->type = TVar10;
  uVar16 = uVar16 + 1;
  if (uVar16 == size) goto LAB_00496e38;
  goto LAB_00496438;
}

Assistant:

TIntermTyped* TIntermediate::promoteConstantUnion(TBasicType promoteTo, TIntermConstantUnion* node) const
{
    const TConstUnionArray& rightUnionArray = node->getConstArray();
    int size = node->getType().computeNumComponents();

    TConstUnionArray leftUnionArray(size);

    for (int i=0; i < size; i++) {

#define PROMOTE(Set, CType, Get) leftUnionArray[i].Set(static_cast<CType>(rightUnionArray[i].Get()))
#define PROMOTE_TO_BOOL(Get) leftUnionArray[i].setBConst(rightUnionArray[i].Get() != 0)

#define TO_ALL(Get)   \
        switch (promoteTo) { \
        case EbtFloat16: PROMOTE(setDConst, double, Get); break; \
        case EbtFloat: PROMOTE(setDConst, double, Get); break; \
        case EbtDouble: PROMOTE(setDConst, double, Get); break; \
        case EbtInt8: PROMOTE(setI8Const, signed char, Get); break; \
        case EbtInt16: PROMOTE(setI16Const, short, Get); break; \
        case EbtInt: PROMOTE(setIConst, int, Get); break; \
        case EbtInt64: PROMOTE(setI64Const, long long, Get); break; \
        case EbtUint8: PROMOTE(setU8Const, unsigned char, Get); break; \
        case EbtUint16: PROMOTE(setU16Const, unsigned short, Get); break; \
        case EbtUint: PROMOTE(setUConst, unsigned int, Get); break; \
        case EbtUint64: PROMOTE(setU64Const, unsigned long long, Get); break; \
        case EbtBool: PROMOTE_TO_BOOL(Get); break; \
        default: return node; \
        }

        switch (node->getType().getBasicType()) {
        case EbtFloat: TO_ALL(getDConst); break;
        case EbtInt: TO_ALL(getIConst); break;
        case EbtUint: TO_ALL(getUConst); break;
        case EbtBool: TO_ALL(getBConst); break;
        case EbtFloat16: TO_ALL(getDConst); break;
        case EbtDouble: TO_ALL(getDConst); break;
        case EbtInt8: TO_ALL(getI8Const); break;
        case EbtInt16: TO_ALL(getI16Const); break;
        case EbtInt64: TO_ALL(getI64Const); break;
        case EbtUint8: TO_ALL(getU8Const); break;
        case EbtUint16: TO_ALL(getU16Const); break;
        case EbtUint64: TO_ALL(getU64Const); break;
        default: return node;
        }
    }

    const TType& t = node->getType();

    return addConstantUnion(leftUnionArray, TType(promoteTo, t.getQualifier().storage, t.getVectorSize(), t.getMatrixCols(), t.getMatrixRows()),
                            node->getLoc());
}